

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O3

bool dg::pta::PointerAnalysisFSInv::invStrongUpdate(PSNode *operand)

{
  long *plVar1;
  PSNode *n;
  bool bVar2;
  byte bVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  ulong uVar7;
  
  plVar1 = *(long **)(operand + 0xc0);
  if (plVar1 == (long *)0x0) {
    return false;
  }
  lVar4 = 0;
  plVar5 = plVar1;
  do {
    uVar7 = plVar5[2];
    lVar6 = 0;
    if (uVar7 != 0) {
      do {
        lVar6 = lVar6 + (ulong)((uint)uVar7 & 1);
        bVar2 = 1 < uVar7;
        uVar7 = uVar7 >> 1;
      } while (bVar2);
    }
    lVar4 = lVar4 + lVar6;
    plVar5 = (long *)*plVar5;
  } while (plVar5 != (long *)0x0);
  if (lVar4 == 1) {
    if ((*(long *)(operand + 200) == 0) || ((plVar1[2] & 1U) != 0)) {
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      do {
        if (lVar4 == 0x3f) {
          lVar4 = 0x40;
          break;
        }
        bVar3 = (byte)lVar4;
        lVar4 = lVar4 + 1;
      } while (((ulong)plVar1[2] >> (bVar3 & 0x3f) & 2) == 0);
    }
    lVar4 = lVar4 * 0x10 + _getConstant;
    if (*(long *)(plVar1[1] * 0x10 + -8 + lVar4) != Offset::UNKNOWN) {
      n = *(PSNode **)(plVar1[1] * 0x10 + -0x10 + lVar4);
      if (INVALIDATED == n) {
        return false;
      }
      if (UNKNOWN_MEMORY == n) {
        return false;
      }
      if (NULLPTR == n) {
        return false;
      }
      bVar2 = PointerAnalysisFS::isOnLoop(n);
      return !bVar2;
    }
  }
  return false;
}

Assistant:

size_t size() const {
        size_t num = 0;
        for (auto &it : _bits)
            num += _countBits(it.second);

        return num;
    }